

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  bool bVar1;
  RapidJSONException *pRVar2;
  int local_64;
  int kMaxDecimalDigit;
  int dExp;
  int dExpAdjust;
  int dLen;
  double result;
  int local_3c;
  size_t sStack_38;
  int exp_local;
  size_t decimalPosition_local;
  size_t length_local;
  char *decimals_local;
  double dStack_18;
  int p_local;
  double d_local;
  
  local_3c = exp;
  sStack_38 = decimalPosition;
  decimalPosition_local = length;
  length_local = (size_t)decimals;
  decimals_local._4_4_ = p;
  dStack_18 = d;
  if (d < 0.0) {
    pRVar2 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (pRVar2,"rapidjson internal assertion failure: d >= 0.0");
    __cxa_throw(pRVar2,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  if (length == 0) {
    pRVar2 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (pRVar2,"rapidjson internal assertion failure: length >= 1");
    __cxa_throw(pRVar2,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  _dExpAdjust = 0.0;
  bVar1 = StrtodFast(d,p,(double *)&dExpAdjust);
  if (bVar1) {
    d_local = _dExpAdjust;
  }
  else {
    if (0x7fffffff < decimalPosition_local) {
      pRVar2 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (pRVar2,"rapidjson internal assertion failure: length <= INT_MAX");
      __cxa_throw(pRVar2,&cereal::RapidJSONException::typeinfo,
                  cereal::RapidJSONException::~RapidJSONException);
    }
    dExp = (int)decimalPosition_local;
    if (decimalPosition_local < sStack_38) {
      pRVar2 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (pRVar2,"rapidjson internal assertion failure: length >= decimalPosition");
      __cxa_throw(pRVar2,&cereal::RapidJSONException::typeinfo,
                  cereal::RapidJSONException::~RapidJSONException);
    }
    if (0x7fffffff < decimalPosition_local - sStack_38) {
      pRVar2 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (pRVar2,"rapidjson internal assertion failure: length - decimalPosition <= INT_MAX")
      ;
      __cxa_throw(pRVar2,&cereal::RapidJSONException::typeinfo,
                  cereal::RapidJSONException::~RapidJSONException);
    }
    local_64 = dExp - (int)sStack_38;
    if (local_3c < local_64 + -0x80000000) {
      pRVar2 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (pRVar2,"rapidjson internal assertion failure: exp >= INT_MIN + dExpAdjust");
      __cxa_throw(pRVar2,&cereal::RapidJSONException::typeinfo,
                  cereal::RapidJSONException::~RapidJSONException);
    }
    local_64 = local_3c - local_64;
    if (0x7fffffff - dExp < local_64) {
      pRVar2 = (RapidJSONException *)__cxa_allocate_exception(0x10);
      cereal::RapidJSONException::RapidJSONException
                (pRVar2,"rapidjson internal assertion failure: dExp <= INT_MAX - dLen");
      __cxa_throw(pRVar2,&cereal::RapidJSONException::typeinfo,
                  cereal::RapidJSONException::~RapidJSONException);
    }
    while( true ) {
      bVar1 = false;
      if (0 < dExp) {
        bVar1 = *(char *)length_local == '0';
      }
      if (!bVar1) break;
      dExp = dExp + -1;
      length_local = length_local + 1;
    }
    while( true ) {
      bVar1 = false;
      if (0 < dExp) {
        bVar1 = *(char *)(length_local + (long)(dExp + -1)) == '0';
      }
      if (!bVar1) break;
      dExp = dExp + -1;
      local_64 = local_64 + 1;
    }
    if (dExp == 0) {
      d_local = 0.0;
    }
    else {
      if (0x300 < dExp) {
        local_64 = dExp + -0x300 + local_64;
        dExp = 0x300;
      }
      if (dExp + local_64 < -0x143) {
        d_local = 0.0;
      }
      else if (dExp + local_64 < 0x136) {
        bVar1 = StrtodDiyFp((char *)length_local,dExp,local_64,(double *)&dExpAdjust);
        if (bVar1) {
          d_local = _dExpAdjust;
        }
        else {
          d_local = StrtodBigInteger(_dExpAdjust,(char *)length_local,dExp,local_64);
        }
      }
      else {
        d_local = std::numeric_limits<double>::infinity();
      }
    }
  }
  return d_local;
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    CEREAL_RAPIDJSON_ASSERT(d >= 0.0);
    CEREAL_RAPIDJSON_ASSERT(length >= 1);

    double result = 0.0;
    if (StrtodFast(d, p, &result))
        return result;

    CEREAL_RAPIDJSON_ASSERT(length <= INT_MAX);
    int dLen = static_cast<int>(length);

    CEREAL_RAPIDJSON_ASSERT(length >= decimalPosition);
    CEREAL_RAPIDJSON_ASSERT(length - decimalPosition <= INT_MAX);
    int dExpAdjust = static_cast<int>(length - decimalPosition);

    CEREAL_RAPIDJSON_ASSERT(exp >= INT_MIN + dExpAdjust);
    int dExp = exp - dExpAdjust;

    // Make sure length+dExp does not overflow
    CEREAL_RAPIDJSON_ASSERT(dExp <= INT_MAX - dLen);

    // Trim leading zeros
    while (dLen > 0 && *decimals == '0') {
        dLen--;
        decimals++;
    }

    // Trim trailing zeros
    while (dLen > 0 && decimals[dLen - 1] == '0') {
        dLen--;
        dExp++;
    }

    if (dLen == 0) { // Buffer only contains zeros.
        return 0.0;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 767 + 1;
    if (dLen > kMaxDecimalDigit) {
        dExp += dLen - kMaxDecimalDigit;
        dLen = kMaxDecimalDigit;
    }

    // If too small, underflow to zero.
    // Any x <= 10^-324 is interpreted as zero.
    if (dLen + dExp <= -324)
        return 0.0;

    // If too large, overflow to infinity.
    // Any x >= 10^309 is interpreted as +infinity.
    if (dLen + dExp > 309)
        return std::numeric_limits<double>::infinity();

    if (StrtodDiyFp(decimals, dLen, dExp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, dLen, dExp);
}